

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcBuilding::IfcBuilding(IfcBuilding *this)

{
  *(undefined ***)&this->field_0x198 = &PTR__Object_007e6a70;
  *(undefined8 *)&this->field_0x1a0 = 0;
  *(char **)&this->field_0x1a8 = "IfcBuilding";
  IfcSpatialStructureElement::IfcSpatialStructureElement
            (&this->super_IfcSpatialStructureElement,&PTR_construction_vtable_24__00829ee0);
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).field_0x160 = 0;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject =
       0x829dd8;
  *(undefined8 *)&this->field_0x198 = 0x829ec8;
  *(undefined8 *)
   &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x88 = 0x829e00;
  (this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x829e28;
  *(undefined8 *)
   &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0x829e50;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.field_0x100 = 0x829e78;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).field_0x158 = 0x829ea0;
  this->field_0x170 = 0;
  (this->ElevationOfTerrain).have = false;
  (this->BuildingAddress).ptr.obj = (LazyObject *)0x0;
  (this->BuildingAddress).have = false;
  return;
}

Assistant:

IfcBuilding() : Object("IfcBuilding") {}